

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O1

int __thiscall CLineInput::OffsetFromActualToDisplay(CLineInput *this,int ActualOffset)

{
  int iVar1;
  int cursor;
  int iVar2;
  bool bVar3;
  
  if (this->m_Hidden == true) {
    iVar2 = 0;
    cursor = 0;
    do {
      if (ActualOffset <= cursor) {
        return iVar2;
      }
      iVar1 = str_utf8_forward(this->m_pStr,cursor);
      iVar2 = iVar2 + 1;
      bVar3 = iVar1 != cursor;
      cursor = iVar1;
    } while (bVar3);
    ActualOffset = (uint)bVar3 + iVar2 + -1;
  }
  return ActualOffset;
}

Assistant:

int CLineInput::OffsetFromActualToDisplay(int ActualOffset) const
{
	if(!IsHidden())
		return ActualOffset;
	int DisplayOffset = 0;
	int CurrentOffset = 0;
	while(CurrentOffset < ActualOffset)
	{
		const int PrevOffset = CurrentOffset;
		CurrentOffset = str_utf8_forward(m_pStr, CurrentOffset);
		if(CurrentOffset == PrevOffset)
			break;
		DisplayOffset++;
	}
	return DisplayOffset;
}